

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

tetrahedron * __thiscall tetgenmesh::tetrahedrontraverse(tetgenmesh *this)

{
  tetrahedron *pppdVar1;
  bool bVar2;
  tetrahedron *newtetrahedron;
  tetgenmesh *this_local;
  
  do {
    pppdVar1 = (tetrahedron *)memorypool::traverse(this->tetrahedrons);
    if (pppdVar1 == (tetrahedron *)0x0) {
      return (tetrahedron *)0x0;
    }
    bVar2 = true;
    if (pppdVar1[4] != (tetrahedron)0x0) {
      bVar2 = pppdVar1[7] == (tetrahedron)this->dummypoint;
    }
  } while (bVar2);
  return pppdVar1;
}

Assistant:

tetgenmesh::tetrahedron* tetgenmesh::tetrahedrontraverse()
{
  tetrahedron *newtetrahedron;

  do {
    newtetrahedron = (tetrahedron *) tetrahedrons->traverse();
    if (newtetrahedron == (tetrahedron *) NULL) {
      return (tetrahedron *) NULL;
    }
  } while ((newtetrahedron[4] == (tetrahedron) NULL) ||
           ((point) newtetrahedron[7] == dummypoint));
  return newtetrahedron;
}